

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find.hpp
# Opt level: O3

void __thiscall
openjij::test::UnionFind_EachNodeIsInEachClusterByDefault_Test::TestBody
          (UnionFind_EachNodeIsInEachClusterByDefault_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *message;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expect;
  UnionFind union_find;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  UnionFind local_98;
  unsigned_long local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  utility::UnionFind::UnionFind(&local_98,7);
  local_48 = 4;
  uStack_40 = 5;
  local_58 = 2;
  uStack_50 = 3;
  local_68 = 0;
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_38 = 6;
  __l._M_len = 7;
  __l._M_array = &local_68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,__l,(allocator_type *)&local_c0);
  pbVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[(long)pbVar3];
    pbVar4 = pbVar3;
    pbVar2 = pbVar1;
    local_c0._M_head_impl = pbVar3;
    if (pbVar1 != pbVar3) {
      do {
        local_c0._M_head_impl = pbVar2;
        pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_c0._M_head_impl];
      } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)local_c0._M_head_impl] !=
               local_c0._M_head_impl);
    }
    while (pbVar2 = pbVar1, local_c0._M_head_impl != pbVar2) {
      local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pbVar4] = (unsigned_long)local_c0._M_head_impl;
      pbVar4 = pbVar2;
      pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)pbVar2];
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_68,"union_find.find_set(node)","expect[node]",
               (unsigned_long *)&local_c0,
               local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + (long)pbVar3);
    if (local_68._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c0);
      message = "";
      if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (pbStack_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/utility/union_find.hpp"
                 ,0x28,message);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_60,pbStack_60);
    }
    pbVar3 = pbVar3 + 1;
  } while (pbVar3 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7)
  ;
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98._rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98._rank.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._rank.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98._parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._parent.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._parent.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._parent.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(UnionFind, EachNodeIsInEachClusterByDefault) {
    auto union_find = openjij::utility::UnionFind(7);

    auto expect = std::vector<decltype(union_find)::Node>{0,1,2,3,4,5,6};
    for (std::size_t node = 0; node < 7; ++node) {
        EXPECT_EQ(union_find.find_set(node), expect[node]);
    }
}